

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_tex_coords_decoder.h
# Opt level: O0

bool __thiscall
draco::
MeshPredictionSchemeTexCoordsDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
::ComputePredictedValue
          (MeshPredictionSchemeTexCoordsDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
           *this,CornerIndex corner_id,int *data,int data_id)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  MeshData *pMVar4;
  const_reference pvVar5;
  Scalar *pSVar6;
  type piVar7;
  int in_ECX;
  long in_RDX;
  undefined4 in_ESI;
  MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
  *in_RDI;
  Scalar SVar8;
  undefined4 extraout_XMM0_Db;
  double dVar9;
  int i_2;
  int i_1;
  int data_offset;
  double v;
  double u;
  bool orientation;
  Vector2f predicted_uv;
  float pnvt;
  float pnvs;
  float pnut;
  float pnus;
  Vector2f pn_uv;
  float t;
  float s;
  float pn_norm2_squared;
  Vector3f cn;
  Vector3f pn;
  Vector3f prev_pos;
  Vector3f next_pos;
  Vector3f tip_pos;
  int i;
  const_iterator __end4;
  const_iterator __begin4;
  initializer_list<int> *__range4;
  Vector2f p_uv;
  Vector2f n_uv;
  int prev_vert_id;
  int next_vert_id;
  int prev_data_id;
  int next_data_id;
  CornerIndex prev_corner_id;
  CornerIndex next_corner_id;
  undefined4 in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  CornerIndex in_stack_fffffffffffffe70;
  int iVar10;
  undefined4 in_stack_fffffffffffffe74;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  undefined4 in_stack_fffffffffffffe80;
  float fVar11;
  int in_stack_fffffffffffffe84;
  undefined4 in_stack_fffffffffffffe88;
  float fVar12;
  undefined4 in_stack_fffffffffffffe8c;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  int iVar13;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffeb0;
  reference local_128;
  byte local_115;
  float local_10c;
  float local_108;
  float local_104;
  float local_100;
  float local_dc;
  float local_d8;
  float local_d4;
  int local_94;
  const_iterator local_90;
  const_iterator local_88;
  int local_80 [2];
  initializer_list<int> local_78;
  initializer_list<int> *local_68;
  uint local_4c;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_48;
  uint local_44;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_40;
  uint local_3c;
  uint local_38;
  int local_34;
  value_type local_30;
  undefined4 local_2c;
  uint local_28;
  undefined4 local_24;
  uint local_20;
  int local_1c;
  long local_18;
  undefined4 local_8;
  bool local_1;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_8 = in_ESI;
  pMVar4 = MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
           ::mesh_data(in_RDI);
  MeshPredictionSchemeData<draco::MeshAttributeCornerTable>::corner_table(pMVar4);
  local_24 = local_8;
  local_20 = (uint)MeshAttributeCornerTable::Next
                             ((MeshAttributeCornerTable *)
                              CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                              in_stack_fffffffffffffe70);
  pMVar4 = MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
           ::mesh_data(in_RDI);
  MeshPredictionSchemeData<draco::MeshAttributeCornerTable>::corner_table(pMVar4);
  local_2c = local_8;
  local_28 = (uint)MeshAttributeCornerTable::Previous
                             ((MeshAttributeCornerTable *)
                              CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                              in_stack_fffffffffffffe70);
  pMVar4 = MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
           ::mesh_data(in_RDI);
  MeshPredictionSchemeData<draco::MeshAttributeCornerTable>::corner_table(pMVar4);
  local_44 = local_20;
  local_40.value_ =
       (uint)MeshAttributeCornerTable::Vertex
                       ((MeshAttributeCornerTable *)
                        CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                        in_stack_fffffffffffffe70);
  local_38 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_40);
  pMVar4 = MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
           ::mesh_data(in_RDI);
  MeshPredictionSchemeData<draco::MeshAttributeCornerTable>::corner_table(pMVar4);
  local_4c = local_28;
  local_48.value_ =
       (uint)MeshAttributeCornerTable::Vertex
                       ((MeshAttributeCornerTable *)
                        CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                        in_stack_fffffffffffffe70);
  local_3c = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_48);
  pMVar4 = MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
           ::mesh_data(in_RDI);
  MeshPredictionSchemeData<draco::MeshAttributeCornerTable>::vertex_to_data_map(pMVar4);
  pvVar5 = std::vector<int,_std::allocator<int>_>::at
                     ((vector<int,_std::allocator<int>_> *)
                      CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70.value_),
                      CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  local_30 = *pvVar5;
  pMVar4 = MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
           ::mesh_data(in_RDI);
  MeshPredictionSchemeData<draco::MeshAttributeCornerTable>::vertex_to_data_map(pMVar4);
  pvVar5 = std::vector<int,_std::allocator<int>_>::at
                     ((vector<int,_std::allocator<int>_> *)
                      CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70.value_),
                      CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  local_34 = *pvVar5;
  if ((local_34 < local_1c) && (local_30 < local_1c)) {
    GetTexCoordForEntryId
              ((MeshPredictionSchemeTexCoordsDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
                *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
               in_stack_fffffffffffffe84,
               (int *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    GetTexCoordForEntryId
              ((MeshPredictionSchemeTexCoordsDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
                *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
               in_stack_fffffffffffffe84,
               (int *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    bVar1 = VectorD<float,_2>::operator==
                      ((VectorD<float,_2> *)
                       CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                       (Self *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    if (bVar1) {
      local_80[0] = 0;
      local_80[1] = 1;
      local_78._M_array = local_80;
      local_78._M_len = 2;
      local_68 = &local_78;
      local_88 = std::initializer_list<int>::begin(local_68);
      local_90 = std::initializer_list<int>::end
                           ((initializer_list<int> *)
                            CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70.value_));
      for (; local_88 != local_90; local_88 = local_88 + 1) {
        local_94 = *local_88;
        pSVar6 = VectorD<float,_2>::operator[]
                           ((VectorD<float,_2> *)
                            CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70.value_),
                            in_stack_fffffffffffffe6c);
        uVar2 = std::isnan((double)(ulong)(uint)*pSVar6);
        if ((((uVar2 & 1) != 0) ||
            (pSVar6 = VectorD<float,_2>::operator[]
                                ((VectorD<float,_2> *)
                                 CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70.value_
                                         ),in_stack_fffffffffffffe6c), 2.1474836e+09 < *pSVar6)) ||
           (pSVar6 = VectorD<float,_2>::operator[]
                               ((VectorD<float,_2> *)
                                CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70.value_)
                                ,in_stack_fffffffffffffe6c), *pSVar6 < -2.1474836e+09)) {
          piVar7 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                             ((unique_ptr<int[],_std::default_delete<int[]>_> *)
                              CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70.value_),
                              CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
          *piVar7 = -0x80000000;
        }
        else {
          pSVar6 = VectorD<float,_2>::operator[]
                             ((VectorD<float,_2> *)
                              CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70.value_),
                              in_stack_fffffffffffffe6c);
          iVar3 = (int)*pSVar6;
          piVar7 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                             ((unique_ptr<int[],_std::default_delete<int[]>_> *)
                              CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70.value_),
                              CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
          *piVar7 = iVar3;
        }
      }
      local_1 = true;
    }
    else {
      GetPositionForEntryId
                ((MeshPredictionSchemeTexCoordsDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
                  *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                 (int)((ulong)in_RDI >> 0x20));
      GetPositionForEntryId
                ((MeshPredictionSchemeTexCoordsDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
                  *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                 (int)((ulong)in_RDI >> 0x20));
      GetPositionForEntryId
                ((MeshPredictionSchemeTexCoordsDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
                  *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                 (int)((ulong)in_RDI >> 0x20));
      VectorD<float,_3>::operator-
                ((VectorD<float,_3> *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                 (Self *)in_RDI);
      VectorD<float,_3>::operator-
                ((VectorD<float,_3> *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                 (Self *)in_RDI);
      local_d4 = VectorD<float,_3>::SquaredNorm((VectorD<float,_3> *)0x1e5ea3);
      if ((*(int *)&in_RDI[1].mesh_data_.corner_table_ < 0x102) || (0.0 < local_d4)) {
        SVar8 = VectorD<float,_3>::Dot
                          ((VectorD<float,_3> *)
                           CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                           (Self *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        local_d8 = SVar8 / local_d4;
        VectorD<float,_3>::operator*
                  ((VectorD<float,_3> *)
                   CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),(Scalar *)in_RDI);
        VectorD<float,_3>::operator-
                  ((VectorD<float,_3> *)
                   CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),(Self *)in_RDI);
        SVar8 = VectorD<float,_3>::SquaredNorm((VectorD<float,_3> *)0x1e5f40);
        dVar9 = std::sqrt((double)CONCAT44(extraout_XMM0_Db,SVar8 / local_d4));
        local_dc = SUB84(dVar9,0);
      }
      else {
        local_d8 = 0.0;
        local_dc = 0.0;
      }
      VectorD<float,_2>::operator-
                ((VectorD<float,_2> *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                 (Self *)in_RDI);
      pSVar6 = VectorD<float,_2>::operator[]
                         ((VectorD<float,_2> *)
                          CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70.value_),
                          in_stack_fffffffffffffe6c);
      SVar8 = *pSVar6;
      fVar11 = local_d8;
      pSVar6 = VectorD<float,_2>::operator[]
                         ((VectorD<float,_2> *)
                          CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70.value_),
                          in_stack_fffffffffffffe6c);
      local_100 = SVar8 * fVar11 + *pSVar6;
      pSVar6 = VectorD<float,_2>::operator[]
                         ((VectorD<float,_2> *)
                          CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70.value_),
                          in_stack_fffffffffffffe6c);
      local_104 = *pSVar6 * local_dc;
      pSVar6 = VectorD<float,_2>::operator[]
                         ((VectorD<float,_2> *)
                          CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70.value_),
                          in_stack_fffffffffffffe6c);
      SVar8 = *pSVar6;
      fVar12 = local_d8;
      pSVar6 = VectorD<float,_2>::operator[]
                         ((VectorD<float,_2> *)
                          CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70.value_),
                          in_stack_fffffffffffffe6c);
      local_108 = SVar8 * fVar12 + *pSVar6;
      pSVar6 = VectorD<float,_2>::operator[]
                         ((VectorD<float,_2> *)
                          CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70.value_),
                          in_stack_fffffffffffffe6c);
      local_10c = *pSVar6 * local_dc;
      VectorD<float,_2>::VectorD
                ((VectorD<float,_2> *)
                 CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70.value_));
      bVar1 = std::vector<bool,_std::allocator<bool>_>::empty(in_stack_fffffffffffffeb0);
      if (bVar1) {
        local_1 = false;
      }
      else {
        local_128 = std::vector<bool,_std::allocator<bool>_>::back
                              ((vector<bool,_std::allocator<bool>_> *)
                               CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
        local_115 = std::_Bit_reference::operator_cast_to_bool(&local_128);
        std::vector<bool,_std::allocator<bool>_>::pop_back
                  ((vector<bool,_std::allocator<bool>_> *)0x1e6101);
        if ((local_115 & 1) == 0) {
          VectorD<float,_2>::VectorD
                    ((VectorD<float,_2> *)in_RDI,
                     (Scalar *)CONCAT44(in_stack_fffffffffffffe8c,fVar12),
                     (Scalar *)CONCAT44(SVar8,fVar11));
        }
        else {
          VectorD<float,_2>::VectorD
                    ((VectorD<float,_2> *)in_RDI,
                     (Scalar *)CONCAT44(in_stack_fffffffffffffe8c,fVar12),
                     (Scalar *)CONCAT44(SVar8,fVar11));
        }
        pSVar6 = VectorD<float,_2>::operator[]
                           ((VectorD<float,_2> *)
                            CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70.value_),
                            in_stack_fffffffffffffe6c);
        dVar9 = floor((double)*pSVar6 + 0.5);
        uVar2 = std::isnan(dVar9);
        if ((((uVar2 & 1) != 0) || (2147483647.0 < dVar9)) || (dVar9 < -2147483648.0)) {
          piVar7 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                             ((unique_ptr<int[],_std::default_delete<int[]>_> *)
                              CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70.value_),
                              CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
          *piVar7 = -0x80000000;
        }
        else {
          iVar3 = (int)dVar9;
          piVar7 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                             ((unique_ptr<int[],_std::default_delete<int[]>_> *)
                              CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70.value_),
                              CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
          *piVar7 = iVar3;
        }
        pSVar6 = VectorD<float,_2>::operator[]
                           ((VectorD<float,_2> *)
                            CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70.value_),
                            in_stack_fffffffffffffe6c);
        dVar9 = floor((double)*pSVar6 + 0.5);
        uVar2 = std::isnan(dVar9);
        if ((((uVar2 & 1) != 0) || (2147483647.0 < dVar9)) || (dVar9 < -2147483648.0)) {
          piVar7 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                             ((unique_ptr<int[],_std::default_delete<int[]>_> *)
                              CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70.value_),
                              CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
          *piVar7 = -0x80000000;
        }
        else {
          iVar3 = (int)dVar9;
          piVar7 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                             ((unique_ptr<int[],_std::default_delete<int[]>_> *)
                              CONCAT44(iVar3,in_stack_fffffffffffffe70.value_),
                              CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
          *piVar7 = iVar3;
        }
        local_1 = true;
      }
    }
  }
  else {
    if (local_30 < local_1c) {
      iVar3 = local_30 *
              in_RDI[1].
              super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
              .transform_.super_PredictionSchemeWrapTransformBase<int>.max_value_;
    }
    else {
      if (local_1c < 1) {
        for (iVar3 = 0;
            iVar3 < in_RDI[1].
                    super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                    .transform_.super_PredictionSchemeWrapTransformBase<int>.max_value_;
            iVar3 = iVar3 + 1) {
          piVar7 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                             ((unique_ptr<int[],_std::default_delete<int[]>_> *)
                              CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70.value_),
                              CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
          *piVar7 = 0;
        }
        return true;
      }
      iVar3 = (local_1c + -1) *
              in_RDI[1].
              super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
              .transform_.super_PredictionSchemeWrapTransformBase<int>.max_value_;
    }
    for (iVar13 = 0;
        iVar13 < in_RDI[1].
                 super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                 .transform_.super_PredictionSchemeWrapTransformBase<int>.max_value_;
        iVar13 = iVar13 + 1) {
      iVar10 = *(int *)(local_18 + (long)(iVar3 + iVar13) * 4);
      piVar7 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                         ((unique_ptr<int[],_std::default_delete<int[]>_> *)
                          CONCAT44(in_stack_fffffffffffffe74,iVar10),
                          CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      *piVar7 = iVar10;
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool MeshPredictionSchemeTexCoordsDecoder<DataTypeT, TransformT, MeshDataT>::
    ComputePredictedValue(CornerIndex corner_id, const DataTypeT *data,
                          int data_id) {
  // Compute the predicted UV coordinate from the positions on all corners
  // of the processed triangle. For the best prediction, the UV coordinates
  // on the next/previous corners need to be already encoded/decoded.
  const CornerIndex next_corner_id =
      this->mesh_data().corner_table()->Next(corner_id);
  const CornerIndex prev_corner_id =
      this->mesh_data().corner_table()->Previous(corner_id);
  // Get the encoded data ids from the next and previous corners.
  // The data id is the encoding order of the UV coordinates.
  int next_data_id, prev_data_id;

  int next_vert_id, prev_vert_id;
  next_vert_id =
      this->mesh_data().corner_table()->Vertex(next_corner_id).value();
  prev_vert_id =
      this->mesh_data().corner_table()->Vertex(prev_corner_id).value();

  next_data_id = this->mesh_data().vertex_to_data_map()->at(next_vert_id);
  prev_data_id = this->mesh_data().vertex_to_data_map()->at(prev_vert_id);

  if (prev_data_id < data_id && next_data_id < data_id) {
    // Both other corners have available UV coordinates for prediction.
    const Vector2f n_uv = GetTexCoordForEntryId(next_data_id, data);
    const Vector2f p_uv = GetTexCoordForEntryId(prev_data_id, data);
    if (p_uv == n_uv) {
      // We cannot do a reliable prediction on degenerated UV triangles.
      // Technically floats > INT_MAX are undefined, but compilers will
      // convert those values to INT_MIN. We are being explicit here for asan.
      for (const int i : {0, 1}) {
        if (std::isnan(p_uv[i]) || static_cast<double>(p_uv[i]) > INT_MAX ||
            static_cast<double>(p_uv[i]) < INT_MIN) {
          predicted_value_[i] = INT_MIN;
        } else {
          predicted_value_[i] = static_cast<int>(p_uv[i]);
        }
      }
      return true;
    }

    // Get positions at all corners.
    const Vector3f tip_pos = GetPositionForEntryId(data_id);
    const Vector3f next_pos = GetPositionForEntryId(next_data_id);
    const Vector3f prev_pos = GetPositionForEntryId(prev_data_id);
    // Use the positions of the above triangle to predict the texture coordinate
    // on the tip corner C.
    // Convert the triangle into a new coordinate system defined by orthogonal
    // bases vectors S, T, where S is vector prev_pos - next_pos and T is an
    // perpendicular vector to S in the same plane as vector the
    // tip_pos - next_pos.
    // The transformed triangle in the new coordinate system is then going to
    // be represented as:
    //
    //        1 ^
    //          |
    //          |
    //          |   C
    //          |  /  \
    //          | /      \
    //          |/          \
    //          N--------------P
    //          0              1
    //
    // Where next_pos point (N) is at position (0, 0), prev_pos point (P) is
    // at (1, 0). Our goal is to compute the position of the tip_pos point (C)
    // in this new coordinate space (s, t).
    //
    const Vector3f pn = prev_pos - next_pos;
    const Vector3f cn = tip_pos - next_pos;
    const float pn_norm2_squared = pn.SquaredNorm();
    // Coordinate s of the tip corner C is simply the dot product of the
    // normalized vectors |pn| and |cn| (normalized by the length of |pn|).
    // Since both of these vectors are normalized, we don't need to perform the
    // normalization explicitly and instead we can just use the squared norm
    // of |pn| as a denominator of the resulting dot product of non normalized
    // vectors.
    float s, t;
    // |pn_norm2_squared| can be exactly 0 when the next_pos and prev_pos are
    // the same positions (e.g. because they were quantized to the same
    // location).
    if (version_ < DRACO_BITSTREAM_VERSION(1, 2) || pn_norm2_squared > 0) {
      s = pn.Dot(cn) / pn_norm2_squared;
      // To get the coordinate t, we can use formula:
      //      t = |C-N - (P-N) * s| / |P-N|
      // Do not use std::sqrt to avoid changes in the bitstream.
      t = sqrt((cn - pn * s).SquaredNorm() / pn_norm2_squared);
    } else {
      s = 0;
      t = 0;
    }

    // Now we need to transform the point (s, t) to the texture coordinate space
    // UV. We know the UV coordinates on points N and P (N_UV and P_UV). Lets
    // denote P_UV - N_UV = PN_UV. PN_UV is then 2 dimensional vector that can
    // be used to define transformation from the normalized coordinate system
    // to the texture coordinate system using a 3x3 affine matrix M:
    //
    //  M = | PN_UV[0]  -PN_UV[1]  N_UV[0] |
    //      | PN_UV[1]   PN_UV[0]  N_UV[1] |
    //      | 0          0         1       |
    //
    // The predicted point C_UV in the texture space is then equal to
    // C_UV = M * (s, t, 1). Because the triangle in UV space may be flipped
    // around the PN_UV axis, we also need to consider point C_UV' = M * (s, -t)
    // as the prediction.
    const Vector2f pn_uv = p_uv - n_uv;
    const float pnus = pn_uv[0] * s + n_uv[0];
    const float pnut = pn_uv[0] * t;
    const float pnvs = pn_uv[1] * s + n_uv[1];
    const float pnvt = pn_uv[1] * t;
    Vector2f predicted_uv;
    if (orientations_.empty()) {
      return false;
    }

    // When decoding the data, we already know which orientation to use.
    const bool orientation = orientations_.back();
    orientations_.pop_back();
    if (orientation) {
      predicted_uv = Vector2f(pnus - pnvt, pnvs + pnut);
    } else {
      predicted_uv = Vector2f(pnus + pnvt, pnvs - pnut);
    }
    if (std::is_integral<DataTypeT>::value) {
      // Round the predicted value for integer types.
      // Technically floats > INT_MAX are undefined, but compilers will
      // convert those values to INT_MIN. We are being explicit here for asan.
      const double u = floor(predicted_uv[0] + 0.5);
      if (std::isnan(u) || u > INT_MAX || u < INT_MIN) {
        predicted_value_[0] = INT_MIN;
      } else {
        predicted_value_[0] = static_cast<int>(u);
      }
      const double v = floor(predicted_uv[1] + 0.5);
      if (std::isnan(v) || v > INT_MAX || v < INT_MIN) {
        predicted_value_[1] = INT_MIN;
      } else {
        predicted_value_[1] = static_cast<int>(v);
      }
    } else {
      predicted_value_[0] = static_cast<int>(predicted_uv[0]);
      predicted_value_[1] = static_cast<int>(predicted_uv[1]);
    }

    return true;
  }
  // Else we don't have available textures on both corners. For such case we
  // can't use positions for predicting the uv value and we resort to delta
  // coding.
  int data_offset = 0;
  if (prev_data_id < data_id) {
    // Use the value on the previous corner as the prediction.
    data_offset = prev_data_id * num_components_;
  }
  if (next_data_id < data_id) {
    // Use the value on the next corner as the prediction.
    data_offset = next_data_id * num_components_;
  } else {
    // None of the other corners have a valid value. Use the last encoded value
    // as the prediction if possible.
    if (data_id > 0) {
      data_offset = (data_id - 1) * num_components_;
    } else {
      // We are encoding the first value. Predict 0.
      for (int i = 0; i < num_components_; ++i) {
        predicted_value_[i] = 0;
      }
      return true;
    }
  }
  for (int i = 0; i < num_components_; ++i) {
    predicted_value_[i] = data[data_offset + i];
  }
  return true;
}